

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

double __thiscall CMU462::Matrix4x4::norm(Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = Vector4D::norm2(this->entries);
  dVar2 = Vector4D::norm2(this->entries + 1);
  dVar3 = Vector4D::norm2(this->entries + 2);
  dVar4 = Vector4D::norm2(this->entries + 3);
  dVar4 = dVar4 + dVar3 + dVar2 + dVar1;
  if (0.0 <= dVar4) {
    return SQRT(dVar4);
  }
  dVar1 = sqrt(dVar4);
  return dVar1;
}

Assistant:

double Matrix4x4::norm( void ) const {
    return sqrt( entries[0].norm2() +
                 entries[1].norm2() +
                 entries[2].norm2() +
				         entries[3].norm2());
  }